

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

UBool icu_63::compat_SyncMutableUTextContents(UText *ut)

{
  ushort uVar1;
  void *pvVar2;
  UBool UVar3;
  int64_t iVar4;
  UChar *pUVar5;
  int iVar6;
  
  iVar4 = utext_nativeLength_63(ut);
  if (iVar4 == ut->nativeIndexingLimit) {
    UVar3 = '\0';
  }
  else {
    pvVar2 = ut->context;
    uVar1 = *(ushort *)((long)pvVar2 + 8);
    if ((short)uVar1 < 0) {
      iVar6 = *(int *)((long)pvVar2 + 0xc);
    }
    else {
      iVar6 = (int)(short)uVar1 >> 5;
    }
    if (((int)(short)uVar1 & 0x11U) == 0) {
      if ((uVar1 & 2) == 0) {
        pUVar5 = *(UChar **)((long)pvVar2 + 0x18);
      }
      else {
        pUVar5 = (UChar *)((long)pvVar2 + 10);
      }
    }
    else {
      pUVar5 = (UChar *)0x0;
    }
    ut->chunkContents = pUVar5;
    ut->chunkLength = iVar6;
    ut->chunkNativeLimit = (long)iVar6;
    ut->nativeIndexingLimit = iVar6;
    UVar3 = '\x01';
  }
  return UVar3;
}

Assistant:

static UBool compat_SyncMutableUTextContents(UText *ut) {
    UBool retVal = FALSE;

    //  In the following test, we're really only interested in whether the UText should switch
    //  between heap and stack allocation.  If length hasn't changed, we won't, so the chunkContents
    //  will still point to the correct data.
    if (utext_nativeLength(ut) != ut->nativeIndexingLimit) {
        UnicodeString *us=(UnicodeString *)ut->context;

        // Update to the latest length.
        // For example, (utext_nativeLength(ut) != ut->nativeIndexingLimit).
        int32_t newLength = us->length();

        // Update the chunk description.
        // The buffer may have switched between stack- and heap-based.
        ut->chunkContents    = us->getBuffer();
        ut->chunkLength      = newLength;
        ut->chunkNativeLimit = newLength;
        ut->nativeIndexingLimit = newLength;
        retVal = TRUE;
    }

    return retVal;
}